

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

data<Imath_3_2::half> * __thiscall
anon_unknown.dwarf_61d64::data<Imath_3_2::half>::operator<<(data<Imath_3_2::half> *this,float value)

{
  data<Imath_3_2::half> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *pvVar1;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->_inserting_result & 1U) == 0) {
    pvVar1 = &in_RDI->_current_sample;
    Imath_3_2::half::half((half *)in_stack_ffffffffffffffe0,(float)((ulong)pvVar1 >> 0x20));
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::push_back
              (in_stack_ffffffffffffffe0,(value_type *)pvVar1);
  }
  else {
    pvVar1 = &in_RDI->_current_result;
    Imath_3_2::half::half((half *)pvVar1,(float)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::push_back
              (pvVar1,in_stack_ffffffffffffffd8);
  }
  in_RDI->_started = true;
  return in_RDI;
}

Assistant:

data& operator<< (float value)
    {
        if (_inserting_result) { _current_result.push_back (value); }
        else { _current_sample.push_back (T (value)); }
        _started = true;
        return *this;
    }